

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF.hh
# Opt level: O0

void __thiscall
QPDF::EncryptionData::EncryptionData
          (EncryptionData *this,int V,int R,int Length_bytes,int P,string *O,string *U,string *OE,
          string *UE,string *Perms,string *id1,bool encrypt_metadata)

{
  bool encrypt_metadata_local;
  string *O_local;
  int P_local;
  int Length_bytes_local;
  int R_local;
  int V_local;
  EncryptionData *this_local;
  
  this->V = V;
  this->R = R;
  this->Length_bytes = Length_bytes;
  this->P = P;
  std::__cxx11::string::string((string *)&this->O,(string *)O);
  std::__cxx11::string::string((string *)&this->U,(string *)U);
  std::__cxx11::string::string((string *)&this->OE,(string *)OE);
  std::__cxx11::string::string((string *)&this->UE,(string *)UE);
  std::__cxx11::string::string((string *)&this->Perms,(string *)Perms);
  std::__cxx11::string::string((string *)&this->id1,(string *)id1);
  this->encrypt_metadata = encrypt_metadata;
  return;
}

Assistant:

EncryptionData(
            int V,
            int R,
            int Length_bytes,
            int P,
            std::string const& O,
            std::string const& U,
            std::string const& OE,
            std::string const& UE,
            std::string const& Perms,
            std::string const& id1,
            bool encrypt_metadata) :
            V(V),
            R(R),
            Length_bytes(Length_bytes),
            P(P),
            O(O),
            U(U),
            OE(OE),
            UE(UE),
            Perms(Perms),
            id1(id1),
            encrypt_metadata(encrypt_metadata)
        {
        }